

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O2

int PHF::init<phf_string,false>(phf *phf,phf_string *k,size_t n,size_t l,size_t a,phf_seed_t seed)

{
  undefined8 *puVar1;
  long *plVar2;
  ulong *puVar3;
  undefined8 *puVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  byte bVar9;
  undefined8 uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  size_t __nmemb;
  size_t sVar13;
  phf_string *__base;
  int *piVar14;
  uint32_t *puVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  size_t __nmemb_00;
  ulong uVar23;
  phf_string *ppVar24;
  long lVar25;
  size_t sVar26;
  phf_string *ppVar27;
  phf_string *ppVar28;
  phf_string *ppVar29;
  bool bVar30;
  phf_string k_00;
  void *local_50;
  void *local_48;
  
  __nmemb_00 = n + (n == 0);
  uVar17 = l + (l == 0);
  sVar13 = 100;
  if (a < 100) {
    sVar13 = a;
  }
  phf->nodiv = false;
  __nmemb = phf_primeup(((__nmemb_00 + uVar17) - 1) / uVar17);
  sVar13 = phf_primeup((__nmemb_00 * 100) / (sVar13 + (sVar13 == 0)));
  if (sVar13 == 0 || __nmemb == 0) {
    iVar22 = 0x22;
  }
  else {
    __base = (phf_string *)calloc(__nmemb_00,0x20);
    if ((__base == (phf_string *)0x0) || (local_50 = calloc(__nmemb,8), local_50 == (void *)0x0)) {
      local_48 = (void *)0x0;
      local_50 = (void *)0x0;
    }
    else {
      lVar25 = 0;
      sVar26 = n;
      while (bVar30 = sVar26 != 0, sVar26 = sVar26 - 1, bVar30) {
        k_00.n = *(size_t *)((long)&k->n + lVar25);
        k_00.p = *(void **)((long)&k->p + lVar25);
        uVar11 = phf_g<phf_string>(k_00,seed);
        auVar5._8_8_ = 0;
        auVar5._0_8_ = __nmemb;
        lVar18 = SUB168(ZEXT416(uVar11) % auVar5,0);
        puVar4 = (undefined8 *)((long)&k->p + lVar25);
        uVar10 = puVar4[1];
        puVar1 = (undefined8 *)((long)&__base->p + lVar25 * 2);
        *puVar1 = *puVar4;
        puVar1[1] = uVar10;
        *(int *)((long)&__base[1].p + lVar25 * 2) = SUB164(ZEXT416(uVar11) % auVar5,0);
        *(void **)((long)&__base[1].n + lVar25 * 2) = (void *)((long)local_50 + lVar18 * 8);
        plVar2 = (long *)((long)local_50 + lVar18 * 8);
        *plVar2 = *plVar2 + 1;
        lVar25 = lVar25 + 0x10;
      }
      qsort(__base,__nmemb_00,0x20,phf_keycmp<phf_string>);
      uVar17 = sVar13 + 0x3f >> 6;
      local_48 = calloc(uVar17 * 2,8);
      if (local_48 == (void *)0x0) {
        local_48 = (void *)0x0;
      }
      else {
        puVar15 = (uint32_t *)calloc(__nmemb,4);
        if (puVar15 != (uint32_t *)0x0) {
          uVar19 = 0;
          ppVar27 = __base;
LAB_0012f4ee:
          uVar19 = uVar19 & 0xffffffff;
          if ((ppVar27 < __base + n * 2) && (*(long *)ppVar27[1].n != 0)) {
            ppVar24 = ppVar27 + *(long *)ppVar27[1].n * 2;
            uVar23 = 0;
            do {
              uVar23 = uVar23 + 1;
              ppVar28 = ppVar27;
              while( true ) {
                uVar11 = (uint32_t)uVar23;
                ppVar29 = ppVar27;
                if (ppVar24 <= ppVar28) goto LAB_0012f5b8;
                uVar12 = phf_f<phf_string>(uVar11,*ppVar28,seed);
                auVar6._8_8_ = 0;
                auVar6._0_8_ = sVar13;
                uVar20 = SUB168(ZEXT416(uVar12) % auVar6,0);
                uVar16 = uVar20 >> 6 & 0x3ffffff;
                uVar21 = 1L << (SUB161(ZEXT416(uVar12) % auVar6,0) & 0x3f);
                if (((*(ulong *)((long)local_48 + uVar16 * 8) >> (uVar20 & 0x3f) & 1) != 0) ||
                   (uVar20 = *(ulong *)((long)local_48 + uVar16 * 8 + uVar17 * 8),
                   (uVar20 & uVar21) != 0)) break;
                *(ulong *)((long)local_48 + uVar16 * 8 + uVar17 * 8) = uVar20 | uVar21;
                ppVar28 = ppVar28 + 2;
              }
              for (; ppVar29 < ppVar24; ppVar29 = ppVar29 + 2) {
                uVar12 = phf_f<phf_string>(uVar11,*ppVar29,seed);
                auVar7._8_8_ = 0;
                auVar7._0_8_ = sVar13;
                bVar9 = SUB161(ZEXT416(uVar12) % auVar7,0) & 0x3f;
                puVar3 = (ulong *)((long)local_48 +
                                  (SUB168(ZEXT416(uVar12) % auVar7,0) >> 6 & 0x3ffffff) * 8 +
                                  uVar17 * 8);
                *puVar3 = *puVar3 & (-2L << bVar9 | 0xfffffffffffffffeU >> 0x40 - bVar9);
              }
            } while( true );
          }
          phf->seed = seed;
          phf->r = __nmemb;
          phf->m = sVar13;
          phf->g = puVar15;
          phf->d_max = uVar19;
          phf->g_op = PHF_G_UINT32_MOD_R;
          phf->g_jmp = (void *)0x0;
          iVar22 = 0;
          goto LAB_0012f44f;
        }
      }
    }
    piVar14 = __errno_location();
    iVar22 = *piVar14;
LAB_0012f44f:
    free(local_48);
    free(local_50);
    free(__base);
  }
  return iVar22;
LAB_0012f5b8:
  for (; ppVar29 < ppVar24; ppVar29 = ppVar29 + 2) {
    uVar12 = phf_f<phf_string>(uVar11,*ppVar29,seed);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = sVar13;
    puVar3 = (ulong *)((long)local_48 + (SUB168(ZEXT416(uVar12) % auVar8,0) >> 6 & 0x3ffffff) * 8);
    *puVar3 = *puVar3 | 1L << (SUB161(ZEXT416(uVar12) % auVar8,0) & 0x3f);
  }
  puVar15[*(uint *)&ppVar27[1].p] = uVar11;
  ppVar27 = ppVar24;
  if (uVar19 < uVar23) {
    uVar19 = uVar23;
  }
  goto LAB_0012f4ee;
}

Assistant:

PHF_PUBLIC int PHF::init(struct phf *phf, const key_t k[], const size_t n, const size_t l, const size_t a, const phf_seed_t seed) {
	size_t n1 = PHF_MAX(n, 1); /* for computations that require n > 0 */
	size_t l1 = PHF_MAX(l, 1);
	size_t a1 = PHF_MAX(PHF_MIN(a, 100), 1);
	size_t r; /* number of buckets */
	size_t m; /* size of output array */
	phf_key<key_t> *B_k = NULL; /* linear bucket-slot array */
	size_t *B_z = NULL;         /* number of slots per bucket */
	phf_key<key_t> *B_p, *B_pe;
	phf_bits_t *T = NULL; /* bitmap to track index occupancy */
	phf_bits_t *T_b;      /* per-bucket working bitmap */
	size_t T_n;
	uint32_t *g = NULL; /* displacement map */
	uint32_t d_max = 0; /* maximum displacement value */
	int error;

	if ((phf->nodiv = nodiv)) {
		/* round to power-of-2 so we can use bit masks instead of modulo division */
		r = phf_powerup(n1 / PHF_MIN(l1, n1));
		m = phf_powerup((n1 * 100) / a1);
	} else {
		r = phf_primeup(PHF_HOWMANY(n1, l1));
		/* XXX: should we bother rounding m to prime number for small n? */
		m = phf_primeup((n1 * 100) / a1);
	}

	if (r == 0 || m == 0)
		return ERANGE;

	if (!(B_k = static_cast<phf_key<key_t> *>(calloc(n1, sizeof *B_k))))
		goto syerr;
	if (!(B_z = static_cast<size_t *>(calloc(r, sizeof *B_z))))
		goto syerr;

	for (size_t i = 0; i < n; i++) {
		phf_hash_t g = phf_g_mod_r<nodiv>(k[i], seed, r);

		B_k[i].k = k[i];
		B_k[i].g = g;
		B_k[i].n = &B_z[g];
		++*B_k[i].n;
	}

	qsort(B_k, n1, sizeof *B_k, reinterpret_cast<int(*)(const void *, const void *)>(&phf_keycmp<key_t>));

	T_n = PHF_HOWMANY(m, PHF_BITS(*T));
	if (!(T = static_cast<phf_bits_t *>(calloc(T_n * 2, sizeof *T))))
		goto syerr;
	T_b = &T[T_n]; /* share single allocation */

	/*
	 * FIXME: T_b[] is unnecessary. We could clear T[] the same way we
	 * clear T_b[]. In fact, at the end of generation T_b[] is identical
	 * to T[] because we don't clear T_b[] on success.
	 *
	 * We just need to tweak the current reset logic to stop before the
	 * key that failed, and then we can elide the commit to T[] at the
	 * end of the outer loop.
	 */

	if (!(g = static_cast<uint32_t *>(calloc(r, sizeof *g))))
		goto syerr;

	B_p = B_k;
	B_pe = &B_k[n];

	for (; B_p < B_pe && *B_p->n > 0; B_p += *B_p->n) {
		phf_key<key_t> *Bi_p, *Bi_pe;
		size_t d = 0;
		uint32_t f;
retry:
		d++;
		Bi_p = B_p;
		Bi_pe = B_p + *B_p->n;

		for (; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);

			if (phf_isset(T, f) || phf_isset(T_b, f)) {
				/* reset T_b[] */
				for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
					f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
					phf_clrbit(T_b, f);
				}

				goto retry;
			} else {
				phf_setbit(T_b, f);
			}
		}

		/* commit to T[] */
		for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
			phf_setbit(T, f);
		}

		/* commit to g[] */
		g[B_p->g] = d;
		d_max = PHF_MAX(d, d_max);
	}

	phf->seed = seed;
	phf->r = r;
	phf->m = m;

	phf->g = g;
	g = NULL;

	phf->d_max = d_max;
	phf->g_op = (nodiv)? phf::PHF_G_UINT32_BAND_R : phf::PHF_G_UINT32_MOD_R;
	phf->g_jmp = NULL;

	error = 0;

	goto clean;
syerr:
	error = errno;
clean:
	free(g);
	free(T);
	free(B_z);
	free(B_k);

	return error;
}